

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O0

char * clib_extsym(CTState *cts,CType *ct,GCstr *name)

{
  CType *ctf;
  GCstr *name_local;
  CType *ct_local;
  CTState *cts_local;
  GCstr *local_28;
  
  if ((ct->sib == 0) || ((cts->tab[ct->sib].info & 0xf0ff0000) != 0x80040000)) {
    local_28 = name + 1;
  }
  else {
    local_28 = (GCstr *)((ulong)cts->tab[ct->sib].name.gcptr32 + 0x10);
  }
  return (char *)local_28;
}

Assistant:

static const char *clib_extsym(CTState *cts, CType *ct, GCstr *name)
{
  if (ct->sib) {
    CType *ctf = ctype_get(cts, ct->sib);
    if (ctype_isxattrib(ctf->info, CTA_REDIR))
      return strdata(gco2str(gcref(ctf->name)));
  }
  return strdata(name);
}